

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib560.c
# Opt level: O1

int test(char *URL)

{
  bool bVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  char *pcVar10;
  timeval tVar11;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1d8;
  int local_1d4;
  undefined8 local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  lVar5 = curl_easy_init();
  iVar4 = 0;
  if (lVar5 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                  ,0x36);
    iVar4 = 0x7c;
  }
  lVar7 = 0;
  if (lVar5 != 0) {
    iVar3 = curl_easy_setopt(lVar5,0x2712,URL);
    uVar2 = _stderr;
    iVar4 = 0;
    if (iVar3 != 0) {
      uVar6 = curl_easy_strerror(iVar3);
      curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                    ,0x39,iVar3,uVar6);
      iVar4 = iVar3;
    }
    if (iVar4 == 0) {
      iVar3 = curl_easy_setopt(lVar5,0x2a,1);
      uVar2 = _stderr;
      iVar4 = 0;
      if (iVar3 != 0) {
        uVar6 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                      ,0x3a,iVar3,uVar6);
        iVar4 = iVar3;
      }
      lVar7 = 0;
      if (iVar4 != 0) goto LAB_00102382;
      iVar3 = curl_easy_setopt(lVar5,0x40,0);
      uVar2 = _stderr;
      iVar4 = 0;
      if (iVar3 != 0) {
        uVar6 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                      ,0x3b,iVar3,uVar6);
        iVar4 = iVar3;
      }
      if (iVar4 == 0) {
        iVar3 = curl_easy_setopt(lVar5,0x51,0);
        uVar2 = _stderr;
        iVar4 = 0;
        if (iVar3 != 0) {
          uVar6 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                        ,0x3c,iVar3,uVar6);
          iVar4 = iVar3;
        }
        if (iVar4 == 0) {
          lVar7 = curl_multi_init();
          if (lVar7 == 0) {
            curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                          ,0x3f);
            iVar4 = 0x7b;
          }
          else {
            iVar4 = curl_multi_add_handle(lVar7,lVar5);
            uVar2 = _stderr;
            if (iVar4 == 0) {
              iVar4 = 0;
            }
            else {
              uVar6 = curl_multi_strerror(iVar4);
              curl_mfprintf(uVar2,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                            ,0x42,iVar4,uVar6);
            }
            if (iVar4 == 0) {
              iVar4 = curl_multi_perform(lVar7,&local_1d8);
              uVar2 = _stderr;
              if (iVar4 == 0) {
                iVar4 = 0;
                if (local_1d8 < 0) {
                  curl_mfprintf(_stderr,
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                ,0x45);
                  iVar4 = 0x7a;
                }
              }
              else {
                uVar6 = curl_multi_strerror(iVar4);
                curl_mfprintf(uVar2,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                              ,0x45,iVar4,uVar6);
              }
              if (iVar4 == 0) {
                tVar11 = tutil_tvnow();
                lVar8 = tutil_tvdiff(tVar11,tv_test_start);
                iVar4 = 0;
                if (lVar8 < 0xea61) {
                  if (local_1d8 != 0) {
                    iVar4 = 0;
                    do {
                      local_1d4 = -99;
                      local_b8.__fds_bits[0] = 0;
                      local_b8.__fds_bits[1] = 0;
                      local_b8.__fds_bits[2] = 0;
                      local_b8.__fds_bits[3] = 0;
                      local_b8.__fds_bits[4] = 0;
                      local_b8.__fds_bits[5] = 0;
                      local_b8.__fds_bits[6] = 0;
                      local_b8.__fds_bits[7] = 0;
                      local_b8.__fds_bits[8] = 0;
                      local_b8.__fds_bits[9] = 0;
                      local_b8.__fds_bits[10] = 0;
                      local_b8.__fds_bits[0xb] = 0;
                      local_b8.__fds_bits[0xc] = 0;
                      local_b8.__fds_bits[0xd] = 0;
                      local_b8.__fds_bits[0xe] = 0;
                      local_b8.__fds_bits[0xf] = 0;
                      local_138.__fds_bits[0] = 0;
                      local_138.__fds_bits[1] = 0;
                      local_138.__fds_bits[2] = 0;
                      local_138.__fds_bits[3] = 0;
                      local_138.__fds_bits[4] = 0;
                      local_138.__fds_bits[5] = 0;
                      local_138.__fds_bits[6] = 0;
                      local_138.__fds_bits[7] = 0;
                      local_138.__fds_bits[8] = 0;
                      local_138.__fds_bits[9] = 0;
                      local_138.__fds_bits[10] = 0;
                      local_138.__fds_bits[0xb] = 0;
                      local_138.__fds_bits[0xc] = 0;
                      local_138.__fds_bits[0xd] = 0;
                      local_138.__fds_bits[0xe] = 0;
                      local_138.__fds_bits[0xf] = 0;
                      local_1b8.__fds_bits[0xe] = 0;
                      local_1b8.__fds_bits[0xf] = 0;
                      local_1b8.__fds_bits[0xc] = 0;
                      local_1b8.__fds_bits[0xd] = 0;
                      local_1b8.__fds_bits[10] = 0;
                      local_1b8.__fds_bits[0xb] = 0;
                      local_1b8.__fds_bits[8] = 0;
                      local_1b8.__fds_bits[9] = 0;
                      local_1b8.__fds_bits[6] = 0;
                      local_1b8.__fds_bits[7] = 0;
                      local_1b8.__fds_bits[4] = 0;
                      local_1b8.__fds_bits[5] = 0;
                      local_1b8.__fds_bits[2] = 0;
                      local_1b8.__fds_bits[3] = 0;
                      local_1b8.__fds_bits[0] = 0;
                      local_1b8.__fds_bits[1] = 0;
                      local_1c8.tv_sec = 1;
                      local_1c8.tv_usec = 0;
                      iVar3 = curl_multi_fdset(lVar7,&local_b8,&local_138,&local_1b8,&local_1d4);
                      uVar2 = _stderr;
                      if (iVar3 == 0) {
                        if (local_1d4 < -1) {
                          curl_mfprintf(_stderr,
                                        "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                        ,0x5a);
                          iVar4 = 0x7a;
                        }
                      }
                      else {
                        uVar6 = curl_multi_strerror(iVar3);
                        curl_mfprintf(uVar2,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                      ,0x5a,iVar3,uVar6);
                        iVar4 = iVar3;
                      }
                      bVar1 = true;
                      if (iVar4 == 0) {
                        iVar4 = select_wrapper(local_1d4 + 1,&local_b8,&local_138,&local_1b8,
                                               &local_1c8);
                        if (iVar4 == -1) {
                          piVar9 = __errno_location();
                          iVar4 = *piVar9;
                          local_1d0 = _stderr;
                          pcVar10 = strerror(iVar4);
                          curl_mfprintf(local_1d0,"%s:%d select() failed, with errno %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                        ,0x5e,iVar4,pcVar10);
                          iVar4 = 0x79;
                        }
                        else {
                          tVar11 = tutil_tvnow();
                          lVar8 = tutil_tvdiff(tVar11,tv_test_start);
                          if (lVar8 < 0xea61) {
                            iVar4 = curl_multi_perform(lVar7,&local_1d8);
                            uVar2 = _stderr;
                            if (iVar4 == 0) {
                              iVar4 = 0;
                              if (local_1d8 < 0) {
                                curl_mfprintf(_stderr,
                                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                              ,99);
                                iVar4 = 0x7a;
                              }
                            }
                            else {
                              uVar6 = curl_multi_strerror(iVar4);
                              curl_mfprintf(uVar2,
                                            "%s:%d curl_multi_perform() failed, with code %d (%s)\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                            ,99,iVar4,uVar6);
                            }
                            if (iVar4 == 0) {
                              tVar11 = tutil_tvnow();
                              lVar8 = tutil_tvdiff(tVar11,tv_test_start);
                              iVar4 = 0;
                              bVar1 = 60000 < lVar8;
                              if (60000 < lVar8) {
                                curl_mfprintf(_stderr,
                                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                              ,0x65);
                                iVar4 = 0x7d;
                              }
                            }
                          }
                          else {
                            curl_mfprintf(_stderr,
                                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                          ,0x60);
                            iVar4 = 0x7d;
                          }
                        }
                      }
                    } while ((!bVar1) && (local_1d8 != 0));
                  }
                }
                else {
                  curl_mfprintf(_stderr,
                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib560.c"
                                ,0x47);
                  iVar4 = 0x7d;
                }
              }
            }
          }
          goto LAB_00102382;
        }
      }
    }
    lVar7 = 0;
  }
LAB_00102382:
  curl_multi_cleanup(lVar7);
  curl_easy_cleanup(lVar5);
  curl_global_cleanup();
  return iVar4;
}

Assistant:

int test(char *URL)
{
  CURL *http_handle = NULL;
  CURLM *multi_handle = NULL;
  int res = 0;

  int still_running; /* keep number of running handles */

  start_test_timing();

  /*
  ** curl_global_init called indirectly from curl_easy_init.
  */

  easy_init(http_handle);

  /* set options */
  easy_setopt(http_handle, CURLOPT_URL, URL);
  easy_setopt(http_handle, CURLOPT_HEADER, 1L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYPEER, 0L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYHOST, 0L);

  /* init a multi stack */
  multi_init(multi_handle);

  /* add the individual transfers */
  multi_add_handle(multi_handle, http_handle);

  /* we start some action by calling perform right away */
  multi_perform(multi_handle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    /* get file descriptors from the transfers */
    multi_fdset(multi_handle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    /* timeout or readable/writable sockets */
    multi_perform(multi_handle, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi_handle);
  curl_easy_cleanup(http_handle);
  curl_global_cleanup();

  return res;
}